

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O1

int mbedtls_ssl_get_ciphersuite_id(char *ciphersuite_name)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  int iVar2;
  int iVar3;
  mbedtls_ssl_ciphersuite_t *pmVar4;
  
  iVar3 = 0;
  if (ciphersuite_name != (char *)0x0) {
    pmVar4 = ciphersuite_definitions;
    do {
      iVar2 = strcmp(pmVar4->name,ciphersuite_name);
      if (iVar2 == 0) goto LAB_00219bf8;
      pmVar1 = pmVar4 + 1;
      pmVar4 = pmVar4 + 1;
    } while (pmVar1->id != 0);
  }
  pmVar4 = (mbedtls_ssl_ciphersuite_t *)0x0;
LAB_00219bf8:
  if (pmVar4 != (mbedtls_ssl_ciphersuite_t *)0x0) {
    iVar3 = pmVar4->id;
  }
  return iVar3;
}

Assistant:

int mbedtls_ssl_get_ciphersuite_id(const char *ciphersuite_name)
{
    const mbedtls_ssl_ciphersuite_t *cur;

    cur = mbedtls_ssl_ciphersuite_from_string(ciphersuite_name);

    if (cur == NULL) {
        return 0;
    }

    return cur->id;
}